

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

Expression * __thiscall wasm::DataFlow::Graph::makeUse(Graph *this,Node *node)

{
  Type TVar1;
  size_t sVar2;
  char *pcVar3;
  anon_union_8_3_b615221d_for_Node_2 aVar4;
  Type TVar5;
  Expression *pEVar6;
  Const *pCVar7;
  LocalSet *pLVar8;
  Id index;
  MixedArena *this_00;
  Literal local_70;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  Builder local_38;
  Builder builder;
  
  local_38.wasm = this->module;
  TVar1 = node->type;
  if (TVar1 == Phi) {
    index = (node->field_1).index;
  }
  else {
    if (TVar1 != Expr) {
      if (TVar1 != Var) {
        if (TVar1 == Zext) {
          pEVar6 = makeUse(this,*(node->values).
                                 super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          return pEVar6;
        }
        handle_unreachable("unexpected node type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                           ,0x317);
      }
      sVar2 = (this->FAKE_CALL).super_IString.str._M_len;
      pcVar3 = (this->FAKE_CALL).super_IString.str._M_str;
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      aVar4 = node->field_1;
      this_00 = &(local_38.wasm)->allocator;
      pEVar6 = (Expression *)MixedArena::allocSpace(this_00,0x48,8);
      pEVar6->_id = CallId;
      (pEVar6->type).id = 0;
      *(undefined8 *)(pEVar6 + 1) = 0;
      pEVar6[1].type.id = 0;
      *(undefined8 *)(pEVar6 + 2) = 0;
      pEVar6[2].type.id = (uintptr_t)this_00;
      *(undefined8 *)(pEVar6 + 3) = 0;
      pEVar6[3].type.id = 0;
      *(undefined1 *)&pEVar6[4]._id = InvalidId;
      (pEVar6->type).id = (uintptr_t)aVar4;
      *(size_t *)(pEVar6 + 3) = sVar2;
      pEVar6[3].type.id = (uintptr_t)pcVar3;
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar6 + 1),
                 &local_58);
      *(undefined1 *)&pEVar6[4]._id = InvalidId;
      if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return pEVar6;
      }
      operator_delete(local_58.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return pEVar6;
    }
    if (((node->field_1).expr)->_id == ConstId) {
      if (((node->field_1).expr)->_id == ConstId) {
        Literal::Literal(&local_70,(Literal *)((node->field_1).expr + 1));
        pCVar7 = Builder::makeConst(&local_38,&local_70);
        Literal::~Literal(&local_70);
        return (Expression *)pCVar7;
      }
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,"T *wasm::Expression::cast() [T = wasm::Const]");
    }
    pLVar8 = getSet(this,node);
    index = pLVar8->index;
  }
  TVar5 = Function::getLocalType(this->func,index);
  pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar6->_id = LocalGetId;
  pEVar6[1]._id = index;
  (pEVar6->type).id = TVar5.id;
  return pEVar6;
}

Assistant:

Expression* makeUse(Node* node) {
    Builder builder(*module);
    if (node->isPhi()) {
      // The index is the wasm local that we assign to when implementing
      // the phi; get from there.
      auto index = node->index;
      return builder.makeLocalGet(index, func->getLocalType(index));
    } else if (node->isConst()) {
      return builder.makeConst(node->expr->cast<Const>()->value);
    } else if (node->isExpr()) {
      // Find the set we are a value of.
      auto index = getSet(node)->index;
      return builder.makeLocalGet(index, func->getLocalType(index));
    } else if (node->isZext()) {
      // i1 zexts are a no-op for wasm
      return makeUse(node->values[0]);
    } else if (node->isVar()) {
      // Nothing valid for us to read here. Emit a call, representing an unknown
      // variable value.
      return Builder(*module).makeCall(FAKE_CALL, {}, node->wasmType);
    } else {
      WASM_UNREACHABLE("unexpected node type"); // TODO
    }
  }